

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O3

Orphan<capnp::DynamicValue> * __thiscall
capnp::TextCodec::decode
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,TextCodec *this,StringPtr input,
          Type type,Orphanage orphanage)

{
  uint uVar1;
  ElementCount index;
  uint uVar2;
  uint uVar3;
  ListReader **ppLVar4;
  Builder result;
  Reader src;
  ListReader **ppLVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  Orphanage orphanageParam;
  ArrayPtr<const_char> input_00;
  Fault f;
  ThrowingErrorReporter errorReporter;
  ParserInput parserInput;
  Builder lexedTokens;
  ExternalResolver nullResolver;
  ThrowingErrorReporter errorReporter_1;
  Reader tokens;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  undefined1 local_468 [12];
  undefined4 uStack_45c;
  SegmentBuilder *local_458;
  WirePointer *pWStack_450;
  word local_448;
  SegmentBuilder *local_440;
  CapTableBuilder *local_438;
  word *local_430;
  OrphanBuilder *local_428;
  ErrorReporter local_420;
  long local_418;
  ListReader *local_410;
  uint local_408;
  ListReader *local_400;
  ElementCount local_3f8;
  ListReader *local_3f0;
  uint local_3e8;
  char local_3e0;
  OrphanBuilder local_3d8;
  NullableValue<capnp::Orphan<capnp::DynamicValue>_> local_3b8;
  StructBuilder local_370;
  Resolver local_348;
  ErrorReporter local_340;
  StructReader local_338;
  ListReader local_308;
  ValueTranslator local_2d8;
  MallocMessageBuilder local_2b8;
  CapnpParser local_1c8;
  
  __return_storage_ptr__->type = UNKNOWN;
  local_428 = &__return_storage_ptr__->builder;
  (__return_storage_ptr__->builder).tag.content = 0;
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
  (__return_storage_ptr__->builder).location = (word *)0x0;
  local_420._vptr_ErrorReporter = (_func_int **)&PTR_addError_00626eb0;
  MallocMessageBuilder::MallocMessageBuilder(&local_2b8,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)local_468,&local_2b8.super_MessageBuilder);
  local_1c8.errorReporter = (ErrorReporter *)local_458;
  local_1c8.orphanage.capTable = (CapTableBuilder *)stack0xfffffffffffffba0;
  capnp::_::PointerBuilder::initStruct(&local_370,(PointerBuilder *)&local_1c8,(StructSize)0x10000);
  result._builder.capTable = local_370.capTable;
  result._builder.segment = local_370.segment;
  result._builder.data = local_370.data;
  result._builder.pointers = local_370.pointers;
  result._builder.dataSize = local_370.dataSize;
  result._builder.pointerCount = local_370.pointerCount;
  result._builder._38_2_ = local_370._38_2_;
  input_00.size_ = input.content.size_ - 1;
  input_00.ptr = input.content.ptr;
  capnp::compiler::lex(input_00,result,&local_420);
  orphanageParam = MessageBuilder::getOrphanage(&local_2b8.super_MessageBuilder);
  capnp::compiler::CapnpParser::CapnpParser(&local_1c8,orphanageParam,&local_420);
  capnp::_::StructBuilder::asReader(&local_370);
  bVar8 = local_448.content._4_2_ == 0;
  local_3b8.field_1._8_8_ = pWStack_450;
  if (bVar8) {
    local_3b8.field_1._8_8_ = (WirePointer *)0x0;
  }
  local_3b8.field_1._16_4_ = 0x7fffffff;
  if (!bVar8) {
    local_3b8.field_1._16_4_ = (int)local_440;
  }
  local_3b8.isSet = false;
  local_3b8._1_3_ = 0;
  local_3b8._4_4_ = 0;
  local_3b8.field_1.value.type = UNKNOWN;
  local_3b8.field_1._4_4_ = 0;
  if (!bVar8) {
    local_3b8._0_4_ = local_468._0_4_;
    local_3b8._4_4_ = local_468._4_4_;
    local_3b8.field_1.value.type = local_468._8_4_;
    local_3b8.field_1._4_4_ = uStack_45c;
  }
  capnp::_::PointerReader::getList
            (&local_308,(PointerReader *)&local_3b8,INLINE_COMPOSITE,(word *)0x0);
  local_418 = 0;
  local_408 = 0;
  local_3f8 = local_308.elementCount;
  local_3e8 = 0;
  local_410 = &local_308;
  local_400 = &local_308;
  local_3f0 = &local_308;
  if (local_308.elementCount == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              ((Fault *)local_468,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x57,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal((Fault *)local_468);
  }
  (*(code *)**(undefined8 **)local_1c8.parsers.expression.wrapper)
            (local_468,local_1c8.parsers.expression.wrapper,local_1c8.parsers.expression.parser);
  local_3e0 = local_468[0];
  if ((bool)local_468[0] == true) {
    local_3d8.segment = local_458;
    local_3d8.capTable = (CapTableBuilder *)pWStack_450;
    local_3d8.location = (word *)local_448.content;
    local_3d8.tag.content = (uint64_t)stack0xfffffffffffffba0;
    if (local_408 != local_308.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                ((Fault *)local_468,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x4b,FAILED,"parserInput.getPosition() == tokens.end()",
                 "\"Extra tokens in input.\"",(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal((Fault *)local_468);
    }
    capnp::_::OrphanBuilder::asStructReader(&local_338,&local_3d8,(StructSize)0x20003);
    local_2d8.errorReporter = &local_340;
    local_340._vptr_ErrorReporter = (_func_int **)&PTR_addError_00626eb0;
    local_2d8.resolver = &local_348;
    local_348._vptr_Resolver = (_func_int **)&PTR_resolveConstant_00626ee8;
    local_2d8.orphanage.arena = orphanage.arena;
    local_2d8.orphanage.capTable = orphanage.capTable;
    src._reader.capTable = local_338.capTable;
    src._reader.segment = local_338.segment;
    src._reader.data = local_338.data;
    src._reader.pointers = local_338.pointers;
    src._reader.dataSize = local_338.dataSize;
    src._reader.pointerCount = local_338.pointerCount;
    src._reader._38_2_ = local_338._38_2_;
    src._reader.nestingLimit = local_338.nestingLimit;
    src._reader._44_4_ = local_338._44_4_;
    capnp::compiler::ValueTranslator::compileValue
              ((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)&local_3b8,&local_2d8,src,type);
    local_468[0] = local_3b8.isSet;
    if (local_3b8.isSet != false) {
      pWStack_450 = (WirePointer *)CONCAT44(local_3b8.field_1._20_4_,local_3b8.field_1._16_4_);
      unique0x1000077c =
           (CapTableReader *)CONCAT44(local_3b8.field_1._4_4_,local_3b8.field_1.value.type);
      local_458 = (SegmentBuilder *)local_3b8.field_1._8_8_;
      local_440 = local_3b8.field_1.value.builder.segment;
      local_438 = local_3b8.field_1.value.builder.capTable;
      local_430 = local_3b8.field_1.value.builder.location;
      local_448.content = (uint64_t)local_3b8.field_1.value.builder.tag.content;
      *(WirePointer **)((long)&__return_storage_ptr__->field_1 + 8) = pWStack_450;
      *(CapTableReader **)__return_storage_ptr__ = unique0x1000077c;
      (__return_storage_ptr__->field_1).intValue = local_3b8.field_1._8_8_;
      if ((__return_storage_ptr__->builder).segment != (SegmentBuilder *)0x0) {
        capnp::_::OrphanBuilder::euthanize(local_428);
      }
      (__return_storage_ptr__->builder).segment = local_3b8.field_1.value.builder.segment;
      (__return_storage_ptr__->builder).capTable = local_3b8.field_1.value.builder.capTable;
      (__return_storage_ptr__->builder).location = local_3b8.field_1.value.builder.location;
      (__return_storage_ptr__->builder).tag.content =
           (uint64_t)local_3b8.field_1.value.builder.tag.content;
    }
  }
  else {
    index = local_3e8;
    if (local_3e8 < local_408) {
      index = local_408;
    }
    if (index == local_308.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                ((Fault *)local_468,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x51,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal((Fault *)local_468);
    }
    capnp::_::ListReader::getStructElement
              ((StructReader *)local_468,(&local_410)[(ulong)(local_408 <= local_3e8) * 4],index);
    uVar6 = 0;
    if ((uint)local_448.content < 0x40) {
      uVar7 = 0;
    }
    else {
      uVar7 = (ulong)*(uint *)((long)&(local_458->super_SegmentReader).arena + 4);
      if (0x9f < (uint)local_448.content) {
        uVar6 = (ulong)*(uint *)&(local_458->super_SegmentReader).ptr.ptr;
      }
    }
    (**local_420._vptr_ErrorReporter)(&local_420,uVar7,uVar6,"Parse error",0xc);
  }
  if ((local_3e0 == '\x01') && (local_3d8.segment != (SegmentBuilder *)0x0)) {
    capnp::_::OrphanBuilder::euthanize(&local_3d8);
  }
  if (local_418 != 0) {
    uVar2 = local_3e8;
    ppLVar4 = &local_3f0;
    if (local_3e8 < local_408) {
      uVar2 = local_408;
      ppLVar4 = &local_410;
    }
    uVar1 = *(uint *)(local_418 + 0x30);
    uVar3 = uVar2;
    if (uVar2 <= uVar1) {
      uVar3 = uVar1;
    }
    ppLVar5 = (ListReader **)(local_418 + 0x28);
    if (uVar1 < uVar2) {
      ppLVar5 = ppLVar4;
    }
    *(ListReader **)(local_418 + 0x28) = *ppLVar5;
    *(uint *)(local_418 + 0x30) = uVar3;
  }
  capnp::compiler::CapnpParser::~CapnpParser(&local_1c8);
  MallocMessageBuilder::~MallocMessageBuilder(&local_2b8);
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> TextCodec::decode(kj::StringPtr input, Type type, Orphanage orphanage) const {
  Orphan<DynamicValue> output;
  
  lexAndParseExpression(input, [&type, &orphanage, &output](compiler::Expression::Reader expression) {
    ThrowingErrorReporter errorReporter;
    ExternalResolver nullResolver;

    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    KJ_IF_MAYBE(value, translator.compileValue(expression, type)) {
      output = *kj::mv(value);
    } else {
      // An error should have already been given to the errorReporter.
    }
  });
  
  return output;
}